

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result wabt::ParseWastScript
                 (WastLexer *lexer,
                 unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script,
                 Errors *errors,WastParseOptions *options)

{
  Result RVar1;
  Enum EVar2;
  WastParser parser;
  WastParser local_c8;
  
  if (out_script == (unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)0x0) {
    __assert_fail("out_script != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                  ,0xe0b,
                  "Result wabt::ParseWastScript(WastLexer *, std::unique_ptr<Script> *, Errors *, WastParseOptions *)"
                 );
  }
  if (options != (WastParseOptions *)0x0) {
    local_c8.last_module_index_ = 0xffffffff;
    local_c8.tokens_.contents_._M_elems[0].loc.filename._M_len = 0;
    local_c8.tokens_.contents_._M_elems[0].loc.filename._M_str._0_4_ = 0;
    local_c8.tokens_.contents_._M_elems[0].loc.filename._M_str._4_4_ = 0;
    local_c8.tokens_.contents_._M_elems[0].loc.field_1.field_0.line = 0;
    local_c8.tokens_.contents_._M_elems[0].loc.field_1._4_8_ = 0;
    local_c8.tokens_.contents_._M_elems[0].token_type_ = First;
    local_c8.tokens_.contents_._M_elems[1].loc.filename._M_len = 0;
    local_c8.tokens_.contents_._M_elems[1].loc.filename._M_str._0_4_ = 0;
    local_c8.tokens_.contents_._M_elems[1].loc.filename._M_str._4_4_ = 0;
    local_c8.tokens_.contents_._M_elems[1].loc.field_1.field_0.line = 0;
    local_c8.tokens_.contents_._M_elems[1].loc.field_1._4_8_ = 0;
    local_c8.tokens_.contents_._M_elems[1].token_type_ = First;
    local_c8.tokens_.size_ = 0;
    local_c8.tokens_.front_ = 0;
    local_c8.lexer_ = lexer;
    local_c8.errors_ = errors;
    local_c8.options_ = options;
    RVar1 = WastParser::ParseScript(&local_c8,out_script);
    EVar2 = Error;
    if (RVar1.enum_ != Error) {
      RVar1 = ResolveNamesScript((out_script->_M_t).
                                 super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>
                                 .super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,errors);
      EVar2 = (Enum)(RVar1.enum_ == Error);
    }
    if (local_c8.tokens_.size_ != 0) {
      do {
        CircularArray<wabt::Token,_2UL>::pop_back(&local_c8.tokens_);
      } while (local_c8.tokens_.size_ != 0);
    }
    return (Result)EVar2;
  }
  __assert_fail("options != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                ,0xe0c,
                "Result wabt::ParseWastScript(WastLexer *, std::unique_ptr<Script> *, Errors *, WastParseOptions *)"
               );
}

Assistant:

Result ParseWastScript(WastLexer* lexer,
                       std::unique_ptr<Script>* out_script,
                       Errors* errors,
                       WastParseOptions* options) {
  assert(out_script != nullptr);
  assert(options != nullptr);
  WastParser parser(lexer, errors, options);
  CHECK_RESULT(parser.ParseScript(out_script));
  CHECK_RESULT(ResolveNamesScript(out_script->get(), errors));
  return Result::Ok;
}